

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<char,_10>::TPZManVector(TPZManVector<char,_10> *this,TPZManVector<char,_10> *copy)

{
  ulong uVar1;
  char *pcVar2;
  TPZVec<char> *in_RSI;
  TPZVec<char> *in_RDI;
  int64_t i;
  int64_t size;
  long local_30;
  
  TPZVec<char>::TPZVec(in_RDI);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZManVector_023d2f48;
  uVar1 = TPZVec<char>::NElements(in_RSI);
  if ((long)uVar1 < 0xb) {
    in_RDI->fStore = (char *)(in_RDI + 1);
    in_RDI->fNElements = uVar1;
    in_RDI->fNAlloc = 0;
  }
  else {
    pcVar2 = (char *)operator_new__(uVar1);
    in_RDI->fStore = pcVar2;
    in_RDI->fNElements = uVar1;
    in_RDI->fNAlloc = uVar1;
  }
  for (local_30 = 0; local_30 < (long)uVar1; local_30 = local_30 + 1) {
    in_RDI->fStore[local_30] = in_RSI->fStore[local_30];
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}